

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessions.c
# Opt level: O0

int cueify_sessions_serialize(cueify_sessions *s,uint8_t *buffer,size_t *size)

{
  byte *pbVar1;
  uint8_t *bp;
  uint16_t sessions_length;
  cueify_sessions_private *sessions;
  size_t *size_local;
  uint8_t *buffer_local;
  cueify_sessions *s_local;
  
  if ((s == (cueify_sessions *)0x0) || (size == (size_t *)0x0)) {
    s_local._4_4_ = 3;
  }
  else {
    *size = 0xc;
    if (buffer == (uint8_t *)0x0) {
      s_local._4_4_ = 0;
    }
    else if (*size < 0xc) {
      s_local._4_4_ = 8;
    }
    else {
      *buffer = '\0';
      buffer[1] = '\n';
      buffer[2] = *(uint8_t *)s;
      buffer[3] = *(uint8_t *)((long)s + 1);
      pbVar1 = buffer + 5;
      buffer[4] = '\0';
      *pbVar1 = 0;
      *pbVar1 = *pbVar1 | *(char *)((long)s + 2) << 4;
      *pbVar1 = *pbVar1 | *(byte *)((long)s + 3) & 0xf;
      buffer[6] = *(uint8_t *)((long)s + 4);
      buffer[7] = '\0';
      buffer[8] = (uint8_t)((uint)*(undefined4 *)(s + 1) >> 0x18);
      buffer[9] = (uint8_t)((uint)*(undefined4 *)(s + 1) >> 0x10);
      buffer[10] = (uint8_t)((uint)*(undefined4 *)(s + 1) >> 8);
      buffer[0xb] = (uint8_t)*(undefined4 *)(s + 1);
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

int cueify_sessions_serialize(cueify_sessions *s, uint8_t *buffer,
			      size_t *size) {
    cueify_sessions_private *sessions = (cueify_sessions_private *)s;
    uint16_t sessions_length;
    uint8_t *bp;

    if (s == NULL || size == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    sessions_length = 12;
    *size = sessions_length;
    if (buffer == NULL) {
	return CUEIFY_OK;
    } else if (*size < sessions_length) {
	return CUEIFY_ERR_TOOSMALL;
    }

    /* TOC Data Length */
    sessions_length -= 2;
    buffer[0] = sessions_length >> 8;
    buffer[1] = sessions_length & 0xFF;

    /* First Complete Session Number */
    buffer[2] = sessions->first_session_number;
    /* Last Complete Session Number */
    buffer[3] = sessions->last_session_number;

    /* TOC Track Descriptor */
    bp = buffer + 4;
    /* Reserved */
    *bp++ = 0;
    /* ADR */
    *bp = 0;
    *bp |= sessions->track_adr << 4;
    /* CONTROL */
    *bp++ |= sessions->track_control & 0x0F;
    /* First Track Number in Last Complete Session */
    *bp++ = sessions->track_number;
    /* Reserved */
    *bp++ = 0;
    /* Start Address of First Track in Last Session (LBA) */
    *bp++ = sessions->track_lba >> 24;
    *bp++ = (sessions->track_lba >> 16) & 0xFF;
    *bp++ = (sessions->track_lba >> 8) & 0xFF;
    *bp++ = sessions->track_lba & 0xFF;

    return CUEIFY_OK;
}